

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O2

bool ON::GetFileStats(FILE *fp,size_t *filesize,time_t *create_time,time_t *lastmodify_time)

{
  int iVar1;
  bool bVar2;
  stat sb;
  stat sStack_b8;
  
  if (filesize != (size_t *)0x0) {
    *filesize = 0;
  }
  if (create_time != (time_t *)0x0) {
    *create_time = 0;
  }
  if (lastmodify_time != (time_t *)0x0) {
    *lastmodify_time = 0;
  }
  if (fp == (FILE *)0x0) {
    bVar2 = false;
  }
  else {
    iVar1 = fileno((FILE *)fp);
    memset(&sStack_b8,0,0x90);
    iVar1 = fstat(iVar1,&sStack_b8);
    bVar2 = iVar1 == 0;
    if (bVar2) {
      if (filesize != (size_t *)0x0) {
        *filesize = sStack_b8.st_size;
      }
      if (create_time != (time_t *)0x0) {
        *create_time = sStack_b8.st_ctim.tv_sec;
      }
      if (lastmodify_time != (time_t *)0x0) {
        *lastmodify_time = sStack_b8.st_mtim.tv_sec;
      }
    }
  }
  return bVar2;
}

Assistant:

bool ON::GetFileStats( FILE* fp,
                       size_t* filesize,
                       time_t* create_time,
                       time_t* lastmodify_time
                      )
{
  bool rc = false;

  if (filesize)
    *filesize = 0;
  if (create_time)
    *create_time = 0;
  if (lastmodify_time)
    *lastmodify_time = 0;

  if ( fp )
  {

#if defined(ON_COMPILER_MSC)

    // Microsoft compilers
    int fd = _fileno(fp);    
#if (_MSC_VER >= 1400)
    // VC 8 (2005) 
    // works for file sizes > 4GB 
    // when size_t is a 64 bit integer
    struct _stat64 sb;
    memset(&sb,0,sizeof(sb));
    int fstat_rc = _fstat64(fd, &sb);
#else
    // VC6 compiler
    // works on most compilers
    struct _stat sb;
    memset(&sb,0,sizeof(sb));
    int fstat_rc = _fstat(fd, &sb);
#endif

#else
    // works on most compilers
    int fd = fileno(fp);
    struct stat sb;
    memset(&sb,0,sizeof(sb));
    int fstat_rc = fstat(fd, &sb);
#endif


    if (0 == fstat_rc)
    {
      if (filesize)
        *filesize = (size_t)sb.st_size;
      if (create_time)
        *create_time = (time_t)sb.st_ctime;
      if (lastmodify_time)
        *lastmodify_time = (time_t)sb.st_mtime;
      rc = true;
    }
  }

  return rc;
}